

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O2

void __thiscall TileWire::addUpdate(TileWire *this,bool isCosmetic,bool noAdjacentUpdates)

{
  Board *pBVar1;
  undefined7 in_register_00000031;
  TileWire *local_20;
  
  pBVar1 = Tile::getBoardPtr(&this->super_Tile);
  local_20 = this;
  std::__detail::
  _Insert<Tile_*,_Tile_*,_std::allocator<Tile_*>,_std::__detail::_Identity,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert((_Insert<Tile_*,_Tile_*,_std::allocator<Tile_*>,_std::__detail::_Identity,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            *)&pBVar1->cosmeticUpdates,(value_type *)&local_20);
  if ((int)CONCAT71(in_register_00000031,isCosmetic) == 0) {
    pBVar1 = Tile::getBoardPtr(&this->super_Tile);
    local_20 = this;
    std::__detail::
    _Insert<TileWire_*,_TileWire_*,_std::allocator<TileWire_*>,_std::__detail::_Identity,_std::equal_to<TileWire_*>,_std::hash<TileWire_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<TileWire_*,_TileWire_*,_std::allocator<TileWire_*>,_std::__detail::_Identity,_std::equal_to<TileWire_*>,_std::hash<TileWire_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&pBVar1->wireUpdates,&local_20);
    if (!noAdjacentUpdates) {
      Tile::_updateAdjacentTiles(&this->super_Tile);
    }
  }
  return;
}

Assistant:

void TileWire::addUpdate(bool isCosmetic, bool noAdjacentUpdates) {
    getBoardPtr()->cosmeticUpdates.insert(this);
    if (!isCosmetic) {
        getBoardPtr()->wireUpdates.insert(this);
        if (!noAdjacentUpdates) {
            _updateAdjacentTiles();
        }
    }
}